

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

pair<bool,_const_char_*> consistentNumberProperty(char *lhs,char *rhs,CompatibleType t)

{
  char *in_RAX;
  long lVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  pair<bool,_const_char_*> pVar5;
  char *pEnd;
  char *local_38;
  
  local_38 = in_RAX;
  lVar1 = strtol(lhs,&local_38,0);
  if ((((local_38 == lhs) || (*local_38 != '\0')) || (piVar2 = __errno_location(), *piVar2 == 0x22))
     || (((lVar3 = strtol(rhs,&local_38,0), local_38 == rhs || (*local_38 != '\0')) ||
         (*piVar2 == 0x22)))) {
    uVar4 = 0;
    lhs = (char *)0x0;
  }
  else {
    if (t == NumberMaxType) {
      if (lVar1 < lVar3) {
        lhs = rhs;
      }
    }
    else if (lVar3 < lVar1) {
      lhs = rhs;
    }
    uVar4 = 1;
  }
  pVar5.second = lhs;
  pVar5._0_8_ = uVar4;
  return pVar5;
}

Assistant:

std::pair<bool, const char*> consistentNumberProperty(const char* lhs,
                                                      const char* rhs,
                                                      CompatibleType t)
{
  char* pEnd;

  const char* const null_ptr = nullptr;

  long lnum = strtol(lhs, &pEnd, 0);
  if (pEnd == lhs || *pEnd != '\0' || errno == ERANGE) {
    return std::pair<bool, const char*>(false, null_ptr);
  }

  long rnum = strtol(rhs, &pEnd, 0);
  if (pEnd == rhs || *pEnd != '\0' || errno == ERANGE) {
    return std::pair<bool, const char*>(false, null_ptr);
  }

  if (t == NumberMaxType) {
    return std::make_pair(true, std::max(lnum, rnum) == lnum ? lhs : rhs);
  }
  return std::make_pair(true, std::min(lnum, rnum) == lnum ? lhs : rhs);
}